

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

string * __thiscall
GrcManager::ExpressionDebugString_abi_cxx11_
          (string *__return_storage_ptr__,GrcManager *this,ExpressionType expt)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_10;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch((int)this) {
  case 1:
  case 4:
  case 5:
    pcVar2 = "integer";
    paVar1 = &local_a;
    break;
  case 2:
    pcVar2 = "boolean";
    paVar1 = &local_b;
    break;
  case 3:
    pcVar2 = "em-units";
    paVar1 = &local_c;
    break;
  case 6:
    pcVar2 = "slot-ref";
    paVar1 = &local_d;
    break;
  case 7:
    pcVar2 = "string";
    paVar1 = &local_e;
    break;
  case 8:
    pcVar2 = "point";
    paVar1 = &local_f;
    break;
  case 9:
    pcVar2 = "gid";
    paVar1 = &local_10;
    break;
  default:
    pcVar2 = "unknown";
    paVar1 = &local_9;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string GrcManager::ExpressionDebugString(ExpressionType expt)
{
	switch (expt)
	{
	default:
	case kexptUnknown:	return "unknown";
	case kexptZero:
	case kexptOne:
	case kexptNumber:	return "integer";
	case kexptBoolean:	return "boolean";
	case kexptMeas:		return "em-units";
	case kexptSlotRef:	return "slot-ref";
	case kexptString:	return "string";
	case kexptPoint:	return "point";
	case kexptGlyphID:	return "gid";
	}
}